

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Man_t *
Gia_ManSweepWithBoxesAndDomains
          (Gia_Man_t *p,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  Gia_Man_t *p_00;
  long lVar5;
  Gia_Man_t *pGVar6;
  int *pReprs;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  int pFlopTypes [3];
  undefined8 local_60;
  uint local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Gia_Man_t *local_40;
  void *local_38;
  
  uVar12 = p->vRegClasses->nSize;
  if ((ulong)uVar12 == 0) {
    uVar10 = 0;
  }
  else {
    puVar2 = (uint *)p->vRegClasses->pArray;
    uVar10 = *puVar2;
    if (1 < (int)uVar12) {
      uVar8 = 1;
      do {
        uVar1 = puVar2[uVar8];
        if ((int)uVar10 <= (int)uVar1) {
          uVar10 = uVar1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
  }
  local_58 = 0;
  local_60 = 0;
  local_50 = fConst;
  local_4c = fEquiv;
  local_48 = fVerbose;
  local_44 = fVerbEquivs;
  local_38 = pParsS;
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweep.c"
                  ,0x28c,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweep.c"
                  ,0x28d,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if ((int)uVar10 < 2) {
    __assert_fail("nDoms > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweep.c"
                  ,0x28e,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  p_00 = Gia_ManDupUnnormalize(p);
  pGVar6 = (Gia_Man_t *)0x0;
  if (p_00 != (Gia_Man_t *)0x0) {
    Gia_ManTransferTiming(p_00,p);
    uVar12 = 1;
    local_40 = p;
    do {
      lVar5 = (long)p_00->vRegClasses->nSize;
      if (lVar5 < 1) {
        uVar8 = 0;
      }
      else {
        lVar9 = 0;
        uVar8 = 0;
        do {
          uVar8 = (ulong)((int)uVar8 + (uint)(p_00->vRegClasses->pArray[lVar9] == uVar12));
          lVar9 = lVar9 + 1;
        } while (lVar5 != lVar9);
      }
      if (1 < (int)uVar8) {
        pGVar6 = Gia_ManDupCollapse(p_00,p_00->pAigExtra,(Vec_Int_t *)0x0,1);
        iVar7 = local_48;
        Gia_ManSweepComputeOneDomainEquivs
                  (pGVar6,p_00->vRegClasses,uVar12,local_38,local_50,local_4c,local_48);
        pReprs = Gia_ManFraigSelectReprs(p_00,pGVar6,iVar7,(int *)&local_60);
        Gia_ManStop(pGVar6);
        Gia_ManTransferTiming(p,p_00);
        pGVar6 = Gia_ManFraigReduceGia(p_00,pReprs);
        Gia_ManTransferTiming(pGVar6,p);
        Gia_ManStop(p_00);
        if (pReprs != (int *)0x0) {
          free(pReprs);
        }
        p_00 = Gia_ManDupWithBoxes(pGVar6,1);
        Gia_ManStop(pGVar6);
        uVar4 = local_60;
        lVar5 = (long)p_00->vRegClasses->nSize;
        if (lVar5 < 1) {
          iVar7 = 0;
        }
        else {
          lVar9 = 0;
          iVar7 = 0;
          do {
            iVar7 = iVar7 + (uint)(p_00->vRegClasses->pArray[lVar9] == uVar12);
            lVar9 = lVar9 + 1;
          } while (lVar5 != lVar9);
        }
        uVar1 = local_60._4_4_;
        uVar11 = (int)uVar8 - (local_60._4_4_ + (int)local_60 + iVar7);
        p = local_40;
        local_58 = uVar11;
        if (local_44 != 0) {
          printf("Domain %2d : %5d -> %5d :  ",(ulong)uVar12,uVar8);
          uVar8 = 0;
          if (0 < (int)uVar11) {
            uVar8 = (ulong)uVar11;
          }
          uVar3 = -uVar11;
          if (-1 < (int)uVar11) {
            uVar3 = 0;
          }
          printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",uVar4 & 0xffffffff,
                 (ulong)uVar1,uVar8,(ulong)uVar3);
          p = local_40;
        }
      }
      bVar13 = uVar12 != uVar10;
      uVar12 = uVar12 + 1;
    } while (bVar13);
    pGVar6 = Gia_ManDupNormalize(p_00,0);
    Gia_ManTransferTiming(pGVar6,p_00);
    Gia_ManStop(p_00);
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxesAndDomains( Gia_Man_t * p, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int nDoms = Vec_IntFindMax(p->vRegClasses);
    int * pReprs, iDom, pFlopTypes[3] = {0};
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    assert( nDoms > 1 );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    // iterate over domains
    for ( iDom = 1; iDom <= nDoms; iDom++ )
    {
        int nFlopsNew, nFlops = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        if ( nFlops < 2 )
            continue;
        // find global equivalences
        pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, 1 );
        // compute equivalences
        Gia_ManSweepComputeOneDomainEquivs( pClp, pNew->vRegClasses, iDom, pParsS, fConst, fEquiv, fVerbose );
        // transfer equivalences
        pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
        Gia_ManStop( pClp );
        // reduce AIG
        Gia_ManTransferTiming( p, pNew );
        pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( pTemp );
        ABC_FREE( pReprs );
        // derive new AIG
        pNew = Gia_ManDupWithBoxes( pTemp = pNew, 1 );
        Gia_ManStop( pTemp );
        // report
        nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
        if ( fVerbEquivs )
        {
            printf( "Domain %2d : %5d -> %5d :  ", iDom, nFlops, nFlopsNew );
            printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
                pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
            //Gia_ManPrintStats( pNew, NULL );
        }
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}